

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O1

Wlc_Ntk_t * Wlc_ReadSmtBuffer(char *pFileName,char *pBuffer,char *pLimit)

{
  char cVar1;
  void *__ptr;
  char *pcVar2;
  Smt_Prs_t *p;
  Abc_Nam_t *p_00;
  long lVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  Wlc_Ntk_t *pWVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  
  uVar8 = 0;
  uVar7 = 0;
  if (pBuffer < pLimit) {
    uVar7 = 0;
    uVar8 = 0;
    pcVar2 = pBuffer;
    do {
      cVar1 = *pcVar2;
      if (cVar1 == '(') {
        uVar8 = uVar8 + 1;
      }
      else if (cVar1 == ')') {
        uVar7 = uVar7 + 1;
      }
      else if (cVar1 == ';') {
        for (; (*pcVar2 != '\0' && (*pcVar2 != '\n')); pcVar2 = pcVar2 + 1) {
          *pcVar2 = ' ';
        }
      }
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 < pLimit);
  }
  if (uVar8 == uVar7) {
    if (uVar8 == 0) {
      puts("The input SMTLIB file has no opening or closing parentheses.");
    }
  }
  else {
    printf("The input SMTLIB file has different number of opening and closing parentheses (%d and %d).\n"
           ,(ulong)uVar8);
    uVar8 = 0;
  }
  if (uVar8 == 0) {
    p = (Smt_Prs_t *)0x0;
  }
  else {
    p = (Smt_Prs_t *)calloc(1,0x430);
    p->pName = pFileName;
    p->pBuffer = pBuffer;
    p->pLimit = pLimit;
    p->pCur = pBuffer;
    p_00 = Abc_NamStart(1000,0x18);
    p->pStrs = p_00;
    iVar11 = 1;
    do {
      lVar3 = 0x18;
      do {
        if (*(int *)((long)Wlc_Names + lVar3 + 0x168) == iVar11) {
          pcVar2 = *(char **)((long)&s_Types[0].Type + lVar3);
          goto LAB_002fe379;
        }
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0xb8);
      pcVar2 = (char *)0x0;
LAB_002fe379:
      Abc_NamStrFindOrAdd(p_00,pcVar2,(int *)0x0);
      iVar11 = iVar11 + 1;
    } while (iVar11 != 0xb);
    iVar11 = Abc_NamObjNumMax(p_00);
    if (iVar11 != 0xb) {
      __assert_fail("Abc_NamObjNumMax(p) == SMT_PRS_END",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                    ,0x61,"void Smt_AddTypes(Abc_Nam_t *)");
    }
    if ((p->vStack).nCap < 100) {
      piVar4 = (p->vStack).pArray;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc(400);
      }
      else {
        piVar4 = (int *)realloc(piVar4,400);
      }
      (p->vStack).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vStack).nCap = 100;
    }
    iVar11 = (p->vObjs).nCap;
    if (iVar11 <= (int)uVar8) {
      iVar9 = uVar8 + 1;
      pVVar5 = (p->vObjs).pArray;
      if (pVVar5 == (Vec_Int_t *)0x0) {
        pVVar5 = (Vec_Int_t *)malloc((long)iVar9 << 4);
      }
      else {
        pVVar5 = (Vec_Int_t *)realloc(pVVar5,(long)iVar9 << 4);
      }
      (p->vObjs).pArray = pVVar5;
      memset(pVVar5 + iVar11,0,(long)(iVar9 - iVar11) << 4);
      (p->vObjs).nCap = iVar9;
    }
  }
  if (p == (Smt_Prs_t *)0x0) {
    return (Wlc_Ntk_t *)0x0;
  }
  Smt_PrsReadLines(p);
  cVar1 = p->ErrorStr[0];
  if (cVar1 != '\0') {
    pcVar2 = p->pBuffer;
    uVar10 = 0;
    if (pcVar2 < p->pCur) {
      uVar10 = 0;
      do {
        uVar10 = (ulong)((int)uVar10 + (uint)(*pcVar2 == '\n'));
        pcVar2 = pcVar2 + 1;
      } while (pcVar2 != p->pCur);
    }
    pWVar6 = (Wlc_Ntk_t *)0x0;
    printf("Line %d: %s\n",uVar10,p->ErrorStr);
    if (cVar1 != '\0') goto LAB_002fe48b;
  }
  pWVar6 = Smt_PrsBuild(p);
LAB_002fe48b:
  if (p->pStrs != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pStrs);
  }
  piVar4 = (p->vStack).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vStack).pArray = (int *)0x0;
  }
  (p->vStack).nCap = 0;
  (p->vStack).nSize = 0;
  if (0 < (p->vObjs).nCap) {
    lVar12 = 8;
    lVar3 = 0;
    do {
      __ptr = *(void **)((long)&((p->vObjs).pArray)->nCap + lVar12);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&((p->vObjs).pArray)->nCap + lVar12) = 0;
      }
      lVar3 = lVar3 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar3 < (p->vObjs).nCap);
  }
  pVVar5 = (p->vObjs).pArray;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    free(pVVar5);
    (p->vObjs).pArray = (Vec_Int_t *)0x0;
  }
  (p->vObjs).nCap = 0;
  (p->vObjs).nSize = 0;
  free(p);
  return pWVar6;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadSmtBuffer( char * pFileName, char * pBuffer, char * pLimit )
{
    Wlc_Ntk_t * pNtk = NULL;
    int nCount = Smt_PrsRemoveComments( pBuffer, pLimit );
    Smt_Prs_t * p = Smt_PrsAlloc( pFileName, pBuffer, pLimit, nCount );
    if ( p == NULL )
        return NULL;
    Smt_PrsReadLines( p );
    //Smt_PrsPrintParser( p );
    if ( Smt_PrsErrorPrint(p) )
        pNtk = Smt_PrsBuild( p );
    Smt_PrsFree( p );
    return pNtk;
}